

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_register_driver
              (char *prefix,_func_int *init,_func_int *shutdown,_func_int_int *setoptions,
              _func_int_int_ptr *getoptions,_func_int_int_ptr *getversion,
              _func_int_char_ptr_char_ptr_char_ptr *checkfile,_func_int_char_ptr_int_int_ptr *open,
              _func_int_char_ptr_int_ptr *create,_func_int_int_LONGLONG *truncate,
              _func_int_int *close,_func_int_char_ptr *fremove,_func_int_int_LONGLONG_ptr *size,
              _func_int_int *flush,_func_int_int_LONGLONG *seek,_func_int_int_void_ptr_long *read,
              _func_int_int_void_ptr_long *write)

{
  _func_int_int *in_RCX;
  _func_int *in_RDX;
  _func_int *in_RSI;
  char *in_RDI;
  _func_int_int_ptr *in_R8;
  _func_int_int_ptr *in_R9;
  _func_int_char_ptr_char_ptr_char_ptr *in_stack_00000008;
  int status;
  _func_int_int *in_stack_00000040;
  _func_int_int_LONGLONG *in_stack_00000048;
  int local_4;
  
  if (no_of_drivers < 0) {
    ffpmsg((char *)0x12230d);
    ffpmsg((char *)0x122319);
    local_4 = 0x7a;
  }
  else if (no_of_drivers + 1 < 0x20) {
    if (in_RDI == (char *)0x0) {
      local_4 = 0x79;
    }
    else if ((in_RSI == (_func_int *)0x0) || (local_4 = (*in_RSI)(), local_4 == 0)) {
      strncpy(driverTable[no_of_drivers].prefix,in_RDI,0x14);
      driverTable[no_of_drivers].prefix[0x13] = '\0';
      driverTable[no_of_drivers].init = in_RSI;
      driverTable[no_of_drivers].shutdown = in_RDX;
      driverTable[no_of_drivers].setoptions = in_RCX;
      driverTable[no_of_drivers].getoptions = in_R8;
      driverTable[no_of_drivers].getversion = in_R9;
      driverTable[no_of_drivers].checkfile = in_stack_00000008;
      driverTable[no_of_drivers].open = (_func_int_char_ptr_int_int_ptr *)getversion;
      driverTable[no_of_drivers].create = (_func_int_char_ptr_int_ptr *)getoptions;
      driverTable[no_of_drivers].truncate = (_func_int_int_LONGLONG *)setoptions;
      driverTable[no_of_drivers].close = (_func_int_int *)shutdown;
      driverTable[no_of_drivers].remove = (_func_int_char_ptr *)init;
      driverTable[no_of_drivers].size = (_func_int_int_LONGLONG_ptr *)prefix;
      driverTable[no_of_drivers].flush = in_stack_00000040;
      driverTable[no_of_drivers].seek = in_stack_00000048;
      driverTable[no_of_drivers].read = (_func_int_int_void_ptr_long *)checkfile;
      driverTable[no_of_drivers].write = (_func_int_int_void_ptr_long *)open;
      no_of_drivers = no_of_drivers + 1;
      local_4 = 0;
    }
  }
  else {
    local_4 = 0x7a;
  }
  return local_4;
}

Assistant:

int fits_register_driver(char *prefix,
	int (*init)(void),
	int (*shutdown)(void),
	int (*setoptions)(int option),
	int (*getoptions)(int *options),
	int (*getversion)(int *version),
	int (*checkfile) (char *urltype, char *infile, char *outfile),
	int (*open)(char *filename, int rwmode, int *driverhandle),
	int (*create)(char *filename, int *driverhandle),
	int (*truncate)(int driverhandle, LONGLONG filesize),
	int (*close)(int driverhandle),
	int (*fremove)(char *filename),
        int (*size)(int driverhandle, LONGLONG *sizex),
	int (*flush)(int driverhandle),
	int (*seek)(int driverhandle, LONGLONG offset),
	int (*read) (int driverhandle, void *buffer, long nbytes),
	int (*write)(int driverhandle, void *buffer, long nbytes) )
/*
  register all the functions needed to support an I/O driver
*/
{
    int status;
 
    if (no_of_drivers < 0 ) {
	  /* This is bad. looks like memory has been corrupted. */
	  ffpmsg("Vital CFITSIO parameters held in memory have been corrupted!!");
	  ffpmsg("Fatal condition detected in fits_register_driver.");
	  return(TOO_MANY_DRIVERS);
    }

    if (no_of_drivers + 1 > MAX_DRIVERS)
        return(TOO_MANY_DRIVERS);

    if (prefix  == NULL)
        return(BAD_URL_PREFIX);
   

    if (init != NULL)		
    { 
        status = (*init)();  /* initialize the driver */
        if (status)
            return(status);
    }

    	/*  fill in data in table */
    strncpy(driverTable[no_of_drivers].prefix, prefix, MAX_PREFIX_LEN);
    driverTable[no_of_drivers].prefix[MAX_PREFIX_LEN - 1] = 0;
    driverTable[no_of_drivers].init = init;
    driverTable[no_of_drivers].shutdown = shutdown;
    driverTable[no_of_drivers].setoptions = setoptions;
    driverTable[no_of_drivers].getoptions = getoptions;
    driverTable[no_of_drivers].getversion = getversion;
    driverTable[no_of_drivers].checkfile = checkfile;
    driverTable[no_of_drivers].open = open;
    driverTable[no_of_drivers].create = create;
    driverTable[no_of_drivers].truncate = truncate;
    driverTable[no_of_drivers].close = close;
    driverTable[no_of_drivers].remove = fremove;
    driverTable[no_of_drivers].size = size;
    driverTable[no_of_drivers].flush = flush;
    driverTable[no_of_drivers].seek = seek;
    driverTable[no_of_drivers].read = read;
    driverTable[no_of_drivers].write = write;

    no_of_drivers++;      /* increment the number of drivers */
    return(0);
 }